

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *pIVar1;
  bool *pbVar2;
  ImVector<ImGuiPopupData> *this;
  ImVec2 IVar3;
  ImGuiViewportP *pIVar4;
  ImGuiWindow *pIVar5;
  ImFontAtlas *atlas;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  int iVar11;
  ImGuiContext *g;
  ImGuiTable *pIVar12;
  ImDrawList *pIVar13;
  ImGuiViewportP **ppIVar14;
  ImDrawList **ppIVar15;
  ImGuiPopupData *pIVar16;
  ImGuiTabBar *tab_bar;
  ImGuiSettingsHandler *pIVar17;
  ImGuiWindowSettings *settings;
  ImGuiTableSettings *settings_00;
  ImGuiWindow **ppIVar18;
  ImU32 col;
  long lVar19;
  char *pcVar20;
  char *pcVar21;
  int rect_n;
  ImVector<ImGuiViewportP_*> *this_00;
  int draw_list_i;
  uint uVar22;
  int iVar23;
  undefined **ppuVar24;
  char **ppcVar25;
  int rect_n_1;
  ImPoolIdx n;
  ulong uVar26;
  int column_n_1;
  ImVector<ImDrawList_*> *this_01;
  undefined1 this_02 [8];
  int layer_i;
  ImVector<ImGuiViewportP_*> *this_03;
  int column_n;
  ulong uVar27;
  ImPool<ImGuiTable> *this_04;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  ImRect IVar37;
  ImVec2 local_1d8;
  int *local_1d0;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  int *local_1b8;
  ImGuiMetricsConfig *local_1b0;
  ImVector<ImGuiViewportP_*> *local_1a8;
  ImVec2 local_1a0;
  undefined1 local_198 [16];
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  bVar28 = 0;
  bVar10 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar8 = GImGui;
  if (bVar10) {
    Text("Dear ImGui %s","1.84 WIP");
    fVar32 = (pIVar8->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar32),0),
         SUB84((double)fVar32,0));
    uVar22 = (pIVar8->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar8->IO).MetricsRenderVertices,
         (ulong)uVar22,(long)(int)uVar22 / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar8->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar8->IO).MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)(pIVar8->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentIdeal";
    wrt_rects_names[7] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    ppuVar24 = &PTR_anon_var_dwarf_c1b1_001ef460;
    ppcVar25 = trt_rects_names;
    for (lVar19 = 0xd; lVar19 != 0; lVar19 = lVar19 + -1) {
      *ppcVar25 = *ppuVar24;
      ppuVar24 = ppuVar24 + (ulong)bVar28 * -2 + 1;
      ppcVar25 = ppcVar25 + (ulong)bVar28 * -2 + 1;
    }
    local_1b8 = &(pIVar8->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar8->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *local_1b8 = 4;
    }
    local_1d0 = &(pIVar8->DebugMetricsConfig).ShowTablesRectsType;
    if ((pIVar8->DebugMetricsConfig).ShowTablesRectsType < 0) {
      *local_1d0 = 2;
    }
    local_1b0 = &pIVar8->DebugMetricsConfig;
    bVar10 = TreeNode("Tools");
    if (bVar10) {
      auVar7._8_8_ = 0;
      auVar7[0] = buf[8];
      auVar7[1] = buf[9];
      auVar7[2] = buf[10];
      auVar7[3] = buf[0xb];
      auVar7[4] = buf[0xc];
      auVar7[5] = buf[0xd];
      auVar7[6] = buf[0xe];
      auVar7[7] = buf[0xf];
      buf._0_16_ = auVar7 << 0x40;
      bVar10 = Button("Item Picker..",(ImVec2 *)buf);
      if (bVar10) {
        GImGui->DebugItemPickerActive = true;
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show windows begin order",&(pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder);
      Checkbox("Show windows rectangles",&local_1b0->ShowWindowsRects);
      SameLine(0.0,-1.0);
      pIVar9 = GImGui;
      fVar32 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar9->NextItemData).Width = fVar32 * 12.0;
      bVar10 = Combo("##show_windows_rect_type",local_1b8,wrt_rects_names,8,8);
      pIVar1 = &pIVar8->DebugMetricsConfig;
      pIVar1->ShowWindowsRects = (bool)(pIVar1->ShowWindowsRects | bVar10);
      if ((pIVar1->ShowWindowsRects != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar8->NavWindow->Name);
        Indent(0.0);
        for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
          IVar37 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar8->NavWindow,(int)lVar19);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar37.Min.x,0),
               SUB84((double)IVar37.Min.y,0),(double)IVar37.Max.x,SUB84((double)IVar37.Max.y,0),
               SUB84((double)(IVar37.Max.x - IVar37.Min.x),0),(double)(IVar37.Max.y - IVar37.Min.y),
               wrt_rects_names[lVar19]);
        }
        Unindent(0.0);
      }
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar8->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar8->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      Checkbox("Show tables rectangles",&(pIVar8->DebugMetricsConfig).ShowTablesRects);
      uVar34 = 0;
      uVar35 = 0;
      SameLine(0.0,-1.0);
      pIVar9 = GImGui;
      fVar32 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar9->NextItemData).Width = fVar32 * 12.0;
      bVar10 = Combo("##show_table_rects_type",local_1d0,trt_rects_names,0xd,0xd);
      pbVar2 = &(pIVar8->DebugMetricsConfig).ShowTablesRects;
      *pbVar2 = (bool)(*pbVar2 | bVar10);
      if ((*pbVar2 != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
        this_04 = &pIVar8->Tables;
        local_188 = this_04;
        for (n = 0; iVar11 = ImPool<ImGuiTable>::GetBufSize(this_04), n < iVar11; n = n + 1) {
          pIVar12 = ImPool<ImGuiTable>::TryGetBufData(this_04,n);
          if ((pIVar12 != (ImGuiTable *)0x0) &&
             (pIVar8->FrameCount + -1 <= pIVar12->LastFrameActive)) {
            if ((pIVar12->OuterWindow == pIVar8->NavWindow) ||
               (pIVar12->InnerWindow == pIVar8->NavWindow)) {
              local_1a8 = (ImVector<ImGuiViewportP_*> *)CONCAT44(local_1a8._4_4_,n);
              BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar12->ID,
                         (ulong)(uint)pIVar12->ColumnsCount,pIVar12->OuterWindow->Name);
              bVar10 = IsItemHovered(0);
              if (bVar10) {
                pIVar13 = GetForegroundDrawList();
                auVar7 = buf._0_16_;
                IVar3 = (pIVar12->OuterRect).Min;
                buf._4_4_ = IVar3.y + -1.0;
                buf._0_4_ = IVar3.x + -1.0;
                buf._8_8_ = auVar7._8_8_;
                IVar3 = (pIVar12->OuterRect).Max;
                local_1d8.y = IVar3.y + 1.0;
                local_1d8.x = IVar3.x + 1.0;
                uVar34 = 0;
                uVar35 = 0;
                ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,&local_1d8,0xff00ffff,0.0,0,2.0);
              }
              Indent(0.0);
              for (uVar26 = 0; uVar26 != 0xd; uVar26 = uVar26 + 1) {
                iVar11 = (int)uVar26;
                if (uVar26 < 6) {
                  IVar37 = ShowMetricsWindow::Funcs::GetTableRect(pIVar12,iVar11,-1);
                  fStack_1c0 = (float)uVar34;
                  local_1c8._0_4_ = IVar37.Max.x;
                  local_1c8._4_4_ = IVar37.Max.y;
                  fStack_1bc = (float)uVar35;
                  local_198._8_4_ = extraout_XMM0_Dc_00;
                  local_198._0_4_ = IVar37.Min.x;
                  local_198._4_4_ = IVar37.Min.y;
                  local_198._12_4_ = extraout_XMM0_Dd_00;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                                 SUB84((double)IVar37.Min.x,0),SUB84((double)IVar37.Min.y,0),
                                 (double)IVar37.Max.x,SUB84((double)IVar37.Max.y,0),
                                 SUB84((double)(IVar37.Max.x - IVar37.Min.x),0),
                                 (double)(IVar37.Max.y - IVar37.Min.y),trt_rects_names[uVar26]);
                  local_1d8.x = 0.0;
                  local_1d8.y = 0.0;
                  Selectable(buf,false,0,&local_1d8);
                  bVar10 = IsItemHovered(0);
                  if (bVar10) {
                    pIVar13 = GetForegroundDrawList();
                    local_1d8.y = (float)local_198._4_4_ + -1.0;
                    local_1d8.x = (float)local_198._0_4_ + -1.0;
                    local_1a0.y = (float)local_1c8._4_4_ + 1.0;
                    local_1a0.x = (float)local_1c8._0_4_ + 1.0;
                    uVar34 = 0;
                    uVar35 = 0;
                    ImDrawList::AddRect(pIVar13,&local_1d8,&local_1a0,0xff00ffff,0.0,0,2.0);
                  }
                }
                else if ((iVar11 == 8) || (iVar11 == 6)) {
                  uVar27 = 0;
                  while (iVar23 = (int)uVar27, iVar23 < pIVar12->ColumnsCount) {
                    IVar37 = ShowMetricsWindow::Funcs::GetTableRect(pIVar12,iVar11,iVar23);
                    fStack_1c0 = (float)uVar34;
                    local_1c8._0_4_ = IVar37.Max.x;
                    local_1c8._4_4_ = IVar37.Max.y;
                    fStack_1bc = (float)uVar35;
                    local_198._8_4_ = extraout_XMM0_Dc;
                    local_198._0_4_ = IVar37.Min.x;
                    local_198._4_4_ = IVar37.Min.y;
                    local_198._12_4_ = extraout_XMM0_Dd;
                    ImFormatString(buf,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar37.Min.x,0),SUB84((double)IVar37.Min.y,0),
                                   (double)IVar37.Max.x,SUB84((double)IVar37.Max.y,0),
                                   SUB84((double)(IVar37.Max.x - IVar37.Min.x),0),
                                   (double)(IVar37.Max.y - IVar37.Min.y),uVar27);
                    local_1d8.x = 0.0;
                    local_1d8.y = 0.0;
                    Selectable(buf,false,0,&local_1d8);
                    bVar10 = IsItemHovered(0);
                    if (bVar10) {
                      pIVar13 = GetForegroundDrawList();
                      local_1d8.y = (float)local_198._4_4_ + -1.0;
                      local_1d8.x = (float)local_198._0_4_ + -1.0;
                      local_1a0.y = (float)local_1c8._4_4_ + 1.0;
                      local_1a0.x = (float)local_1c8._0_4_ + 1.0;
                      uVar34 = 0;
                      uVar35 = 0;
                      ImDrawList::AddRect(pIVar13,&local_1d8,&local_1a0,0xff00ffff,0.0,0,2.0);
                    }
                    uVar27 = (ulong)(iVar23 + 1);
                  }
                }
              }
              Unindent(0.0);
              this_04 = local_188;
              n = (int)local_1a8;
            }
          }
        }
      }
      TreePop();
    }
    local_198._0_8_ = &pIVar8->Windows;
    DebugNodeWindowsList(&pIVar8->Windows,"Windows");
    this_03 = &pIVar8->Viewports;
    uVar22 = 0;
    for (iVar11 = 0; iVar11 < this_03->Size; iVar11 = iVar11 + 1) {
      ppIVar14 = ImVector<ImGuiViewportP_*>::operator[](this_03,iVar11);
      uVar22 = uVar22 + ((*ppIVar14)->DrawDataBuilder).Layers[1].Size +
               ((*ppIVar14)->DrawDataBuilder).Layers[0].Size;
    }
    iVar11 = 0;
    bVar10 = TreeNode("DrawLists","DrawLists (%d)",(ulong)uVar22);
    if (bVar10) {
      for (; local_1a8 = this_03, this_03 = local_1a8, iVar11 < local_1a8->Size; iVar11 = iVar11 + 1
          ) {
        ppIVar14 = ImVector<ImGuiViewportP_*>::operator[](local_1a8,iVar11);
        pIVar4 = *ppIVar14;
        for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
          this_01 = (pIVar4->DrawDataBuilder).Layers + lVar19;
          for (iVar23 = 0; iVar23 < this_01->Size; iVar23 = iVar23 + 1) {
            ppIVar15 = ImVector<ImDrawList_*>::operator[](this_01,iVar23);
            DebugNodeDrawList((ImGuiWindow *)0x0,*ppIVar15,"DrawList");
          }
        }
        this_03 = local_1a8;
      }
      TreePop();
    }
    iVar11 = 0;
    bVar10 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)this_03->Size);
    if (bVar10) {
      fVar32 = GetTreeNodeToLabelSpacing();
      Indent(fVar32);
      pIVar5 = GImGui->CurrentWindow;
      this_00 = &GImGui->Viewports;
      _local_1c8 = _DAT_0018b360;
      for (; iVar23 = this_00->Size, iVar11 < iVar23; iVar11 = iVar11 + 1) {
        ppIVar14 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar11);
        IVar37 = ImGuiViewportP::GetMainRect(*ppIVar14);
        uVar30 = -(uint)(IVar37.Min.y < fStack_1c0);
        uVar31 = -(uint)(IVar37.Min.x < fStack_1bc);
        uVar22 = -(uint)((float)local_1c8._0_4_ < IVar37.Max.y);
        uVar29 = -(uint)((float)local_1c8._4_4_ < IVar37.Max.x);
        auVar36._0_4_ = ~uVar22 & local_1c8._0_4_;
        auVar36._4_4_ = ~uVar29 & local_1c8._4_4_;
        auVar36._8_4_ = ~uVar30 & (uint)fStack_1c0;
        auVar36._12_4_ = ~uVar31 & (uint)fStack_1bc;
        auVar6._4_4_ = (uint)IVar37.Max.x & uVar29;
        auVar6._0_4_ = (uint)IVar37.Max.y & uVar22;
        auVar6._8_4_ = (uint)IVar37.Min.y & uVar30;
        auVar6._12_4_ = (uint)IVar37.Min.x & uVar31;
        _local_1c8 = auVar36 | auVar6;
      }
      IVar3 = (pIVar5->DC).CursorPos;
      fVar32 = local_1c8._8_4_;
      fVar33 = local_1c8._12_4_;
      local_178._8_4_ = fVar32;
      local_178._0_8_ = local_1c8._8_8_;
      local_178._12_4_ = fVar33;
      local_168 = 0.125;
      fStack_164 = 0.125;
      uStack_160 = 0;
      uStack_15c = 0;
      fStack_180 = 0.0 - fVar32 * 0.0;
      fStack_17c = 0.0 - fVar33 * 0.0;
      local_188 = (ImPool<ImGuiTable> *)CONCAT44(IVar3.y - fVar32 * 0.125,IVar3.x - fVar33 * 0.125);
      for (iVar11 = 0; auVar7 = buf._0_16_, iVar11 < iVar23; iVar11 = iVar11 + 1) {
        ppIVar14 = ImVector<ImGuiViewportP_*>::operator[](this_00,iVar11);
        pIVar4 = *ppIVar14;
        IVar3 = (pIVar4->super_ImGuiViewport).Pos;
        fVar32 = IVar3.x;
        fVar33 = IVar3.y;
        IVar3 = (pIVar4->super_ImGuiViewport).Size;
        buf._4_4_ = fVar33 * 0.125 + local_188._4_4_;
        buf._0_4_ = fVar32 * 0.125 + (float)local_188;
        buf._8_4_ = (IVar3.x + fVar32) * 0.125 + (float)local_188;
        buf._12_4_ = (IVar3.y + fVar33) * 0.125 + local_188._4_4_;
        DebugRenderViewportThumbnail(pIVar5->DrawList,pIVar4,(ImRect *)buf);
        iVar23 = this_00->Size;
      }
      buf._4_4_ = ((float)local_1c8._0_4_ - (float)local_178._0_4_) * fStack_164;
      buf._0_4_ = ((float)local_1c8._4_4_ - (float)local_178._4_4_) * local_168;
      buf._8_8_ = auVar7._8_8_;
      Dummy((ImVec2 *)buf);
      fVar32 = GetTreeNodeToLabelSpacing();
      Unindent(fVar32);
      for (iVar11 = 0; iVar11 < this_03->Size; iVar11 = iVar11 + 1) {
        ppIVar14 = ImVector<ImGuiViewportP_*>::operator[](this_03,iVar11);
        DebugNodeViewport(*ppIVar14);
      }
      TreePop();
    }
    bVar10 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar8->OpenPopupStack).Size);
    if (bVar10) {
      this = &pIVar8->OpenPopupStack;
      for (iVar11 = 0; iVar11 < this->Size; iVar11 = iVar11 + 1) {
        pIVar16 = ImVector<ImGuiPopupData>::operator[](this,iVar11);
        pIVar5 = pIVar16->Window;
        pIVar16 = ImVector<ImGuiPopupData>::operator[](this,iVar11);
        pcVar20 = "";
        pcVar21 = "NULL";
        if (pIVar5 != (ImGuiWindow *)0x0) {
          pcVar21 = pIVar5->Name;
          pcVar20 = " ChildWindow";
          if (((uint)pIVar5->Flags >> 0x18 & 1) == 0) {
            pcVar20 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar16->PopupId,pcVar21,pcVar20);
      }
      TreePop();
    }
    iVar11 = 0;
    bVar10 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar8->TabBars).AliveCount);
    if (bVar10) {
      for (; iVar23 = ImPool<ImGuiTabBar>::GetBufSize(&pIVar8->TabBars), iVar11 < iVar23;
          iVar11 = iVar11 + 1) {
        tab_bar = ImPool<ImGuiTabBar>::TryGetBufData(&pIVar8->TabBars,iVar11);
        if (tab_bar != (ImGuiTabBar *)0x0) {
          PushID(tab_bar);
          DebugNodeTabBar(tab_bar,"TabBar");
          PopID();
        }
      }
      TreePop();
    }
    this_02 = (undefined1  [8])&pIVar8->Tables;
    iVar11 = 0;
    bVar10 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar8->Tables).AliveCount);
    if (bVar10) {
      for (; iVar23 = ImPool<ImGuiTable>::GetBufSize((ImPool<ImGuiTable> *)this_02), iVar11 < iVar23
          ; iVar11 = iVar11 + 1) {
        pIVar12 = ImPool<ImGuiTable>::TryGetBufData((ImPool<ImGuiTable> *)this_02,iVar11);
        if (pIVar12 != (ImGuiTable *)0x0) {
          DebugNodeTable(pIVar12);
        }
      }
      TreePop();
    }
    atlas = (pIVar8->IO).Fonts;
    bVar10 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
    if (bVar10) {
      ShowFontAtlas(atlas);
      TreePop();
    }
    bVar10 = TreeNode("Settings");
    if (bVar10) {
      bVar10 = SmallButton("Clear");
      if (bVar10) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar10 = SmallButton("Save to memory");
      if (bVar10) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar10 = SmallButton("Save to disk");
      if (bVar10) {
        SaveIniSettingsToDisk((pIVar8->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((pIVar8->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar8->SettingsDirtyTimer,0));
      bVar10 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                        (ulong)(uint)(pIVar8->SettingsHandlers).Size);
      if (bVar10) {
        for (iVar11 = 0; iVar11 < (pIVar8->SettingsHandlers).Size; iVar11 = iVar11 + 1) {
          pIVar17 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar8->SettingsHandlers,iVar11);
          BulletText("%s",pIVar17->TypeName);
        }
        TreePop();
      }
      bVar10 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                        (ulong)(uint)(pIVar8->SettingsWindows).Buf.Size);
      if (bVar10) {
        settings = (ImGuiWindowSettings *)(pIVar8->SettingsWindows).Buf.Data;
        if (settings != (ImGuiWindowSettings *)0x0) {
          settings = (ImGuiWindowSettings *)&settings->Pos;
        }
        for (; settings != (ImGuiWindowSettings *)0x0;
            settings = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                 (&pIVar8->SettingsWindows,settings)) {
          DebugNodeWindowSettings(settings);
        }
        TreePop();
      }
      bVar10 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                        (ulong)(uint)(pIVar8->SettingsTables).Buf.Size);
      if (bVar10) {
        settings_00 = (ImGuiTableSettings *)(pIVar8->SettingsTables).Buf.Data;
        if (settings_00 != (ImGuiTableSettings *)0x0) {
          settings_00 = (ImGuiTableSettings *)&settings_00->SaveFlags;
        }
        for (; settings_00 != (ImGuiTableSettings *)0x0;
            settings_00 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                    (&pIVar8->SettingsTables,settings_00)) {
          DebugNodeTableSettings(settings_00);
        }
        TreePop();
      }
      iVar11 = (pIVar8->SettingsIniData).Buf.Size;
      uVar26 = (ulong)(iVar11 - 1);
      if (iVar11 == 0) {
        uVar26 = 0;
      }
      bVar10 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar26);
      if (bVar10) {
        pcVar21 = (pIVar8->SettingsIniData).Buf.Data;
        pcVar20 = ImGuiTextBuffer::EmptyString;
        if (pcVar21 != (char *)0x0) {
          pcVar20 = pcVar21;
        }
        buf._4_4_ = GImGui->FontSize * 20.0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = -0x80;
        buf[3] = -0x80;
        InputTextMultiline("##Ini",pcVar20,(long)(pIVar8->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar10 = TreeNode("Internal state");
    if (bVar10) {
      pcVar20 = "NULL";
      Text("WINDOWING");
      Indent(0.0);
      pcVar21 = "NULL";
      if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar8->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar8->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar8->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar8->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar21);
      pcVar21 = "NULL";
      if (pIVar8->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar8->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar21);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar8->ActiveIdTimer,0),(ulong)pIVar8->ActiveId,
           (ulong)pIVar8->ActiveIdPreviousFrame,(ulong)pIVar8->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001ef4d0 + (ulong)pIVar8->ActiveIdSource * 8));
      pcVar21 = "NULL";
      if (pIVar8->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar8->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar21);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar8->HoveredIdTimer,0),(ulong)pIVar8->HoveredId,
           (ulong)pIVar8->HoveredIdPreviousFrame,(ulong)pIVar8->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar8->DragDropActive,(ulong)(pIVar8->DragDropPayload).SourceId,
           (pIVar8->DragDropPayload).DataType);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      pcVar21 = "NULL";
      if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar8->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar21);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar8->NavId,(ulong)pIVar8->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001ef4d0 + (ulong)pIVar8->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar8->IO).NavActive,
           (ulong)(pIVar8->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar8->NavActivateId,
           (ulong)pIVar8->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar8->NavDisableHighlight,
           (ulong)pIVar8->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar8->NavFocusScopeId);
      if (pIVar8->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar20 = pIVar8->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar20);
      Unindent(0.0);
      TreePop();
    }
    if ((local_1b0->ShowWindowsRects != false) ||
       ((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true)) {
      for (iVar11 = 0; iVar11 < ((ImVector<ImGuiWindow_*> *)local_198._0_8_)->Size;
          iVar11 = iVar11 + 1) {
        ppIVar18 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)local_198._0_8_,iVar11);
        pIVar5 = *ppIVar18;
        if (pIVar5->WasActive == true) {
          pIVar13 = GetForegroundDrawList();
          if (local_1b0->ShowWindowsRects == true) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetWindowRect(pIVar5,*local_1b8);
            ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          if (((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar5->Flags & 0x1000000) == 0)) {
            ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar5->BeginOrderWithinContext);
            local_1d8.y = GImGui->FontSize + (pIVar5->Pos).y;
            local_1d8.x = GImGui->FontSize + (pIVar5->Pos).x;
            ImDrawList::AddRectFilled(pIVar13,&pIVar5->Pos,&local_1d8,0xff6464c8,0.0,0);
            ImDrawList::AddText(pIVar13,&pIVar5->Pos,0xffffffff,buf,(char *)0x0);
          }
        }
      }
    }
    if ((pIVar8->DebugMetricsConfig).ShowTablesRects == true) {
      local_1c8 = this_02;
      for (iVar11 = 0; iVar23 = ImPool<ImGuiTable>::GetBufSize((ImPool<ImGuiTable> *)this_02),
          iVar11 < iVar23; iVar11 = iVar11 + 1) {
        pIVar12 = ImPool<ImGuiTable>::TryGetBufData((ImPool<ImGuiTable> *)this_02,iVar11);
        if ((pIVar12 != (ImGuiTable *)0x0) && (pIVar8->FrameCount + -1 <= pIVar12->LastFrameActive))
        {
          pIVar13 = GetForegroundDrawList();
          if (*local_1d0 < 6) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar12,*local_1d0,-1);
            ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          else {
            for (iVar23 = 0; iVar23 < pIVar12->ColumnsCount; iVar23 = iVar23 + 1) {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar12,*local_1d0,iVar23);
              bVar10 = iVar23 == pIVar12->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar10) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,0,
                                  *(float *)(&DAT_0018bd6c + (ulong)bVar10 * 4));
            }
          }
        }
        this_02 = local_1c8;
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetBufSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetBufData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetBufSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetBufData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetBufSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetBufData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Keyboard", "Gamepad", "Nav", "Clipboard" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetBufSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetBufData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}